

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

int Saig_BmcPerform(Aig_Man_t *pAig,int nStart,int nFramesMax,int nNodesMax,int nTimeOut,
                   int nConfMaxOne,int nConfMaxAll,int fVerbose,int fVerbOverwrite,int *piFrames,
                   int fSilent,int fUseSatoko)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Saig_Bmc_t *p;
  Aig_Man_t *pAig_00;
  Cnf_Dat_t *p_00;
  long lVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  Saig_Bmc_t *pSVar12;
  uint uVar13;
  timespec local_70;
  uint local_5c;
  uint local_58;
  int local_54;
  long local_50;
  long local_48;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_54 = 0;
  local_5c = nFramesMax;
  local_3c = nStart;
  if (nTimeOut == 0) {
    lVar8 = 0;
  }
  else {
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    lVar8 = lVar8 + (long)nTimeOut * 1000000;
  }
  uVar13 = local_5c;
  iVar4 = clock_gettime(3,&local_70);
  local_38 = 1;
  local_50 = 1;
  if (-1 < iVar4) {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  iVar4 = clock_gettime(3,&local_70);
  if (-1 < iVar4) {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_38 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  local_58 = nTimeOut;
  local_48 = lVar8;
  if (fVerbose == 0) {
    iVar4 = 0;
  }
  else {
    local_40 = pAig->nRegs;
    uVar9 = pAig->nTruePis;
    uVar1 = pAig->nTruePos;
    iVar4 = pAig->nObjs[6];
    iVar6 = pAig->nObjs[5];
    uVar5 = Aig_ManLevelNum(pAig);
    lVar8 = local_48;
    nTimeOut = local_58;
    uVar13 = local_5c;
    printf("Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar9,
           (ulong)uVar1,(ulong)local_40,(ulong)(uint)(iVar4 + iVar6),(ulong)uVar5);
    printf("Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n",
           (ulong)uVar13,(ulong)(uint)nNodesMax,(ulong)(uint)nConfMaxOne,(ulong)(uint)nConfMaxAll);
    iVar4 = fVerbose;
  }
  uVar9 = 1000000000;
  if (uVar13 != 0) {
    uVar9 = uVar13;
  }
  p = Saig_BmcManStart(pAig,uVar9,nNodesMax,nConfMaxOne,nConfMaxAll,iVar4,fUseSatoko);
  if (nTimeOut != 0) {
    if (p->pSat2 == (satoko_t *)0x0) {
      p->pSat->nRuntimeLimit = lVar8;
    }
    else {
      satoko_set_runtime_limit(p->pSat2,lVar8);
    }
  }
  clock_gettime(3,&local_70);
  pSVar12 = p;
  Saig_BmcInterval(p);
  iVar4 = (int)pSVar12;
  if (p->vTargets->nSize != 0) {
    uVar13 = 0;
    do {
      pAig_00 = Saig_BmcIntervalToAig(p);
      p_00 = Cnf_Derive(pAig_00,pAig_00->nObjs[3]);
      Cnf_DataLift(p_00,p->nSatVars);
      p->nSatVars = p->nSatVars + p_00->nVars;
      Saig_BmcLoadCnf(p,p_00);
      Cnf_DataFree(p_00);
      Aig_ManStop(pAig_00);
      pSVar12 = p;
      iVar6 = Saig_BmcSolveTargets(p,local_3c,&local_54);
      iVar4 = (int)pSVar12;
      if (fVerbose != 0) {
        uVar9 = p->iFrameLast;
        uVar1 = p->iOutputLast;
        iVar4 = p->pFrm->nObjs[6];
        iVar2 = p->pFrm->nObjs[5];
        uVar5 = p->nSatVars;
        local_5c = iVar6;
        if (p->pSat == (sat_solver *)0x0) {
          iVar6 = satoko_conflictnum(p->pSat2);
        }
        else {
          iVar6 = (int)(p->pSat->stats).conflicts;
        }
        printf("%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ",(ulong)uVar13,(ulong)uVar9,
               (ulong)uVar1,(ulong)(uint)(iVar4 + iVar2),(ulong)uVar5,iVar6);
        printf("%4.0f MB",(double)p->nObjs * (double)(p->iFrameLast + 1) * 4.0 * 9.5367431640625e-07
              );
        iVar4 = clock_gettime(3,&local_70);
        if (iVar4 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        printf("%9.2f sec",(double)((float)(lVar8 + local_38) / 1e+06));
        putchar(10);
        fflush(_stdout);
      }
      if (iVar6 != -1) {
        if (iVar6 == 1) {
          if (p->pAig->nTruePos * p->iFrameFail + p->iOutputFail + 1 != local_54) {
            __assert_fail("p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                          ,0x37a,
                          "int Saig_BmcPerform(Aig_Man_t *, int, int, int, int, int, int, int, int, int *, int, int)"
                         );
          }
          if (fSilent == 0) {
            Abc_Print(iVar4,"Output %d of miter \"%s\" was asserted in frame %d. ",
                      (ulong)(uint)p->iOutputFail,p->pAig->pName);
          }
          if (piFrames == (int *)0x0) {
            bVar3 = true;
            goto LAB_00565fd8;
          }
          iVar6 = p->iFrameFail + -1;
          bVar3 = true;
          goto LAB_00565fd6;
        }
        break;
      }
      if (nTimeOut != 0) {
        iVar4 = clock_gettime(3,&local_70);
        if (iVar4 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        if (lVar8 < lVar7) {
          if (fSilent == 0) {
            printf("Reached timeout (%d seconds).\n",(ulong)(uint)nTimeOut);
          }
          if (piFrames != (int *)0x0) {
            *piFrames = p->iFrameLast + -1;
          }
          Saig_BmcManStop(p);
          return -1;
        }
      }
      uVar13 = uVar13 + 1;
      clock_gettime(3,&local_70);
      pSVar12 = p;
      Saig_BmcInterval(p);
      iVar4 = (int)pSVar12;
    } while (p->vTargets->nSize != 0);
  }
  if (fSilent == 0) {
    iVar6 = 1;
    if (1 < p->iFramePrev) {
      iVar6 = p->iFramePrev;
    }
    Abc_Print(iVar4,"No output failed in %d frames.  ",(ulong)(iVar6 - 1));
  }
  if (piFrames == (int *)0x0) {
    bVar3 = false;
  }
  else {
    if (p->iOutputLast < 1) {
      iVar6 = p->iFramePrev + -1;
    }
    else {
      iVar6 = p->iFramePrev + -2;
    }
    bVar3 = false;
LAB_00565fd6:
    *piFrames = iVar6;
  }
LAB_00565fd8:
  if (fSilent != 0) goto LAB_005661cc;
  Abc_Print(iVar4,"%s =","Time");
  iVar4 = 3;
  if (fVerbOverwrite == 0) {
    iVar6 = clock_gettime(3,&local_70);
    if (iVar6 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pcVar10 = "%9.2f sec\n";
  }
  else {
    iVar6 = clock_gettime(3,&local_70);
    if (iVar6 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pcVar10 = "%9.2f sec\r";
  }
  Abc_Print(iVar4,pcVar10,(double)(local_50 + lVar8) / 1000000.0);
  if (bVar3) goto LAB_005661cc;
  uVar11 = (ulong)(uint)p->nFramesMax;
  if (p->iFrameLast < p->nFramesMax) {
    uVar13 = p->nConfMaxAll;
    if (uVar13 != 0) {
      if (p->pSat == (sat_solver *)0x0) {
        iVar4 = satoko_conflictnum(p->pSat2);
        uVar13 = p->nConfMaxAll;
      }
      else {
        iVar4 = (int)(p->pSat->stats).conflicts;
      }
      uVar11 = (ulong)uVar13;
      if ((int)uVar13 < iVar4) {
        pcVar10 = "Reached global conflict limit (%d).\n";
        goto LAB_005661c5;
      }
    }
    if (nTimeOut != 0) {
      iVar4 = clock_gettime(3,&local_70);
      if (iVar4 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      if (local_48 < lVar8) {
        pcVar10 = "Reached timeout (%d seconds).\n";
        uVar11 = (ulong)(uint)nTimeOut;
        goto LAB_005661c5;
      }
    }
    uVar11 = (ulong)(uint)p->nConfMaxOne;
    pcVar10 = "Reached local conflict limit (%d).\n";
  }
  else {
    pcVar10 = "Reached limit on the number of timeframes (%d).\n";
  }
LAB_005661c5:
  printf(pcVar10,uVar11);
LAB_005661cc:
  Saig_BmcManStop(p);
  fflush(_stdout);
}

Assistant:

int Saig_BmcPerform( Aig_Man_t * pAig, int nStart, int nFramesMax, int nNodesMax, int nTimeOut, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fVerbOverwrite, int * piFrames, int fSilent, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    int nOutsSolved = 0;
    int Iter, RetValue = -1;
    abctime nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime clk = Abc_Clock(), clk2, clkTotal = Abc_Clock();
    int Status = -1;
/*
    Vec_Ptr_t * vSimInfo;
    vSimInfo = Abs_ManTernarySimulate( pAig, nFramesMax, fVerbose );
    Abs_ManFreeAray( vSimInfo );
*/
    if ( fVerbose )
    {
        printf( "Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n", 
            nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll );
    } 
    nFramesMax = nFramesMax ? nFramesMax : ABC_INFINITY;
    p = Saig_BmcManStart( pAig, nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll, fVerbose, fUseSatoko );
    // set runtime limit
    if ( nTimeOut )
    {
        if ( p->pSat2 )
            satoko_set_runtime_limit( p->pSat2, nTimeToStop );
        else
            sat_solver_set_runtime_limit( p->pSat, nTimeToStop );
    }
    for ( Iter = 0; ; Iter++ )
    {
        clk2 = Abc_Clock();
        // add new logic interval to frames
        Saig_BmcInterval( p );
//        Saig_BmcAddTargetsAsPos( p );
        if ( Vec_PtrSize(p->vTargets) == 0 )
            break;
        // convert logic slice into new AIG
        pNew = Saig_BmcIntervalToAig( p );
//printf( "StitchVars = %d.\n", p->nStitchVars );
        // derive CNF for the new AIG
        pCnf = Cnf_Derive( pNew, Aig_ManCoNum(pNew) );
        Cnf_DataLift( pCnf, p->nSatVars );
        p->nSatVars += pCnf->nVars;
        // add this CNF to the solver
        Saig_BmcLoadCnf( p, pCnf );
        Cnf_DataFree( pCnf );
        Aig_ManStop( pNew );
        // solve the targets
        RetValue = Saig_BmcSolveTargets( p, nStart, &nOutsSolved );
        if ( fVerbose )
        {
            printf( "%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ", 
                Iter, p->iFrameLast, p->iOutputLast, Aig_ManNodeNum(p->pFrm), p->nSatVars, 
                p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2) );   
            printf( "%4.0f MB",     4.0*(p->iFrameLast+1)*p->nObjs/(1<<20) );
            printf( "%9.2f sec", (float)(Abc_Clock() - clkTotal)/(float)(CLOCKS_PER_SEC) );
            printf( "\n" );
            fflush( stdout );
        }
        if ( RetValue != l_False )
            break;
        // check the timeout
        if ( nTimeOut && Abc_Clock() > nTimeToStop )
        {
            if ( !fSilent )
                printf( "Reached timeout (%d seconds).\n",  nTimeOut );
            if ( piFrames )
                *piFrames = p->iFrameLast-1;
            Saig_BmcManStop( p );
            return Status;
        }
    }
    if ( RetValue == l_True )
    {
        assert( p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved );
        if ( !fSilent )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", 
                p->iOutputFail, p->pAig->pName, p->iFrameFail );
        Status = 0;
        if ( piFrames )
            *piFrames = p->iFrameFail - 1;
    }
    else // if ( RetValue == l_False || RetValue == l_Undef )
    {
        if ( !fSilent )
            Abc_Print( 1, "No output failed in %d frames.  ", Abc_MaxInt(p->iFramePrev-1, 0) );
        if ( piFrames )
        {
            if ( p->iOutputLast > 0 )
                *piFrames = p->iFramePrev - 2;
            else
                *piFrames = p->iFramePrev - 1;
        }
    }
    if ( !fSilent )
    {
        if ( fVerbOverwrite )
        {
            ABC_PRTr( "Time", Abc_Clock() - clk );
        }
        else
        {
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( RetValue != l_True )
        {
            if ( p->iFrameLast >= p->nFramesMax )
                printf( "Reached limit on the number of timeframes (%d).\n", p->nFramesMax );
            else if ( p->nConfMaxAll && (p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2)) > p->nConfMaxAll )
                printf( "Reached global conflict limit (%d).\n", p->nConfMaxAll );
            else if ( nTimeOut && Abc_Clock() > nTimeToStop )
                printf( "Reached timeout (%d seconds).\n", nTimeOut );
            else
                printf( "Reached local conflict limit (%d).\n", p->nConfMaxOne );
        }
    }
    Saig_BmcManStop( p );
    fflush( stdout );
    return Status;
}